

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

string * jwt::base::decode(string *__return_storage_ptr__,string *base,array<char,_64UL> *alphabet,
                          string *fill)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  runtime_error *prVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined7 uVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  string *res;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  uVar8 = base->_M_string_length;
  lVar11 = 0;
  while (fill->_M_string_length < uVar8) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)base);
    if (local_48 == fill->_M_string_length) {
      if (local_48 == 0) {
        bVar13 = true;
      }
      else {
        iVar3 = bcmp(local_50,(fill->_M_dataplus)._M_p,local_48);
        bVar13 = iVar3 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (!bVar13) break;
    uVar8 = uVar8 - fill->_M_string_length;
    lVar11 = lVar11 + -1;
    if (lVar11 == -3) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
LAB_00107894:
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (((int)uVar8 - (int)lVar11 & 3U) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid input");
    goto LAB_00107894;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar8 = uVar8 & 0xfffffffffffffffc;
  for (uVar12 = 0; cVar10 = (char)__return_storage_ptr__, uVar12 < uVar8; uVar12 = uVar12 + 4) {
    pcVar2 = (base->_M_dataplus)._M_p;
    bVar13 = false;
    if (alphabet->_M_elems[0] != pcVar2[uVar12]) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        bVar13 = 0x3e < uVar6;
        if (uVar6 == 0x3f) goto LAB_0010793f;
        uVar7 = uVar6 + 1;
      } while (alphabet->_M_elems[uVar6 + 1] != pcVar2[uVar12]);
      bVar13 = 0x3e < uVar6;
    }
LAB_0010793f:
    if (bVar13) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar13 = false;
    if (alphabet->_M_elems[0] != pcVar2[uVar12 + 1]) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        bVar13 = 0x3e < uVar6;
        if (uVar6 == 0x3f) goto LAB_0010798a;
        uVar7 = uVar6 + 1;
      } while (alphabet->_M_elems[uVar6 + 1] != pcVar2[uVar12 + 1]);
      bVar13 = 0x3e < uVar6;
    }
LAB_0010798a:
    if (bVar13) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar13 = false;
    if (alphabet->_M_elems[0] != pcVar2[uVar12 + 2]) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        bVar13 = 0x3e < uVar6;
        if (uVar6 == 0x3f) goto LAB_001079d2;
        uVar7 = uVar6 + 1;
      } while (alphabet->_M_elems[uVar6 + 1] != pcVar2[uVar12 + 2]);
      bVar13 = 0x3e < uVar6;
    }
LAB_001079d2:
    if (bVar13) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar13 = false;
    if (alphabet->_M_elems[0] != pcVar2[uVar12 + 3]) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        bVar13 = 0x3e < uVar6;
        if (uVar6 == 0x3f) goto LAB_00107a14;
        uVar7 = uVar6 + 1;
      } while (alphabet->_M_elems[uVar6 + 1] != pcVar2[uVar12 + 3]);
      bVar13 = 0x3e < uVar6;
    }
LAB_00107a14:
    if (bVar13) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Invalid input");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
    std::__cxx11::string::push_back(cVar10);
  }
  if (lVar11 == 0) {
    return __return_storage_ptr__;
  }
  pcVar2 = (base->_M_dataplus)._M_p;
  uVar9 = 0;
  bVar13 = false;
  iVar3 = 0;
  if (alphabet->_M_elems[0] != pcVar2[uVar8]) {
    iVar3 = 0;
    uVar12 = 0;
    do {
      uVar7 = uVar12;
      bVar13 = 0x3e < uVar7;
      if (uVar7 == 0x3f) {
        uVar9 = 0;
        iVar3 = 0;
        goto LAB_00107aac;
      }
      iVar3 = iVar3 + 0x40000;
      uVar12 = uVar7 + 1;
    } while (alphabet->_M_elems[uVar7 + 1] != pcVar2[uVar8]);
    bVar13 = 0x3e < uVar7;
    uVar9 = (undefined7)(uVar7 + 1 >> 8);
  }
LAB_00107aac:
  if (bVar13) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid input");
  }
  else {
    cVar1 = pcVar2[uVar8 + 1];
    uVar12 = CONCAT71(uVar9,cVar1);
    bVar13 = false;
    iVar5 = 0;
    if (alphabet->_M_elems[0] != cVar1) {
      iVar5 = 0;
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        bVar13 = 0x3e < uVar6;
        if (uVar6 == 0x3f) {
          iVar5 = 0;
          goto LAB_00107af7;
        }
        iVar5 = iVar5 + 0x1000;
        uVar7 = uVar6 + 1;
      } while (alphabet->_M_elems[uVar6 + 1] != cVar1);
      bVar13 = 0x3e < uVar6;
    }
LAB_00107af7:
    if (!bVar13) {
      if (lVar11 == -1) {
        uVar7 = 0;
        if (alphabet->_M_elems[0] != pcVar2[uVar8 + 2]) {
          uVar7 = 0;
          do {
            uVar6 = uVar7;
            if (uVar6 == 0x3f) {
              uVar7 = (ulong)(0x3e < uVar6);
              goto LAB_00107b4b;
            }
            uVar12 = uVar6 + 1;
            uVar7 = uVar12;
          } while (alphabet->_M_elems[uVar6 + 1] != pcVar2[uVar8 + 2]);
          uVar7 = CONCAT71((int7)(uVar12 >> 8),0x3e < uVar6);
          uVar12 = uVar6;
        }
LAB_00107b4b:
        if ((char)uVar7 != '\0') {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10,uVar12,uVar7,iVar5 + iVar3);
          std::runtime_error::runtime_error(prVar4,"Invalid input");
          goto LAB_00107cc6;
        }
        std::__cxx11::string::push_back(cVar10);
      }
      std::__cxx11::string::push_back(cVar10);
      return __return_storage_ptr__;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10,uVar12,iVar3,iVar5);
    std::runtime_error::runtime_error(prVar4,"Invalid input");
  }
LAB_00107cc6:
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string decode(const std::string& base, const std::array<char, 64>& alphabet, const std::string& fill) {
			size_t size = base.size();

			size_t fill_cnt = 0;
			while (size > fill.size()) {
				if (base.substr(size - fill.size(), fill.size()) == fill) {
					fill_cnt++;
					size -= fill.size();
					if(fill_cnt > 2)
						throw std::runtime_error("Invalid input");
				}
				else break;
			}

			if ((size + fill_cnt) % 4 != 0)
				throw std::runtime_error("Invalid input");

			size_t out_size = size / 4 * 3;
			std::string res;
			res.reserve(out_size);

			auto get_sextet = [&](size_t offset) {
				for (size_t i = 0; i < alphabet.size(); i++) {
					if (alphabet[i] == base[offset])
						return static_cast<uint32_t>(i);
				}
				throw std::runtime_error("Invalid input");
			};

			
			size_t fast_size = size - size % 4;
			for (size_t i = 0; i < fast_size;) {
				uint32_t sextet_a = get_sextet(i++);
				uint32_t sextet_b = get_sextet(i++);
				uint32_t sextet_c = get_sextet(i++);
				uint32_t sextet_d = get_sextet(i++);

				uint32_t triple = (sextet_a << 3 * 6)
					+ (sextet_b << 2 * 6)
					+ (sextet_c << 1 * 6)
					+ (sextet_d << 0 * 6);

				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				res += (triple >> 0 * 8) & 0xFF;
			}

			if (fill_cnt == 0)
				return res;

			uint32_t triple = (get_sextet(fast_size) << 3 * 6)
				+ (get_sextet(fast_size + 1) << 2 * 6);

			switch (fill_cnt) {
			case 1:
				triple |= (get_sextet(fast_size + 2) << 1 * 6);
				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				break;
			case 2:
				res += (triple >> 2 * 8) & 0xFF;
				break;
			default:
				break;
			}

			return res;
		}